

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_stop_seq(Parser *this)

{
  Tree *pTVar1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  bool bVar6;
  char msg [49];
  char local_78 [24];
  char *pcStack_60;
  char local_58 [24];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  pTVar1 = this->m_tree;
  uVar2 = this->m_state->node_id;
  if ((uVar2 == 0xffffffffffffffff) || (pTVar1->m_cap <= uVar2)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = -0x7a;
    local_78[9] = 'K';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    pcStack_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58[0] = 'e';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[uVar2].m_type.type & SEQ) == NOTYPE) {
    builtin_strncpy(local_58,"state->node_id))",0x11);
    builtin_strncpy(local_78 + 0x10,"_tree->i",8);
    pcStack_60 = (char *)0x5f6d287165735f73;
    builtin_strncpy(local_78,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_40 = 0;
    uStack_38 = 0x78c4;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x78c4) << 0x40);
    LVar4.name.str._0_4_ = 0x1fa88a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x31,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  return;
}

Assistant:

void Parser::_stop_seq()
{
    _c4dbgp("stop_seq");
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
}